

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O3

bool woff2::TransformGlyfAndLocaTables(Font *font)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out;
  undefined4 uVar1;
  undefined4 uVar2;
  pointer puVar3;
  byte bVar4;
  undefined1 auVar5 [12];
  byte bVar6;
  uint8_t *__src;
  mapped_type *pmVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  const_iterator __begin2;
  Table *pTVar11;
  Table *this;
  pointer pvVar12;
  uint uVar13;
  const_iterator __end2;
  uint uVar14;
  Point *point;
  pointer pPVar15;
  byte bVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  short sVar28;
  undefined8 extraout_XMM1_Qa;
  short sVar26;
  short sVar27;
  undefined1 in_XMM1 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar38;
  GlyfEncoder encoder;
  Glyph glyph;
  size_t glyph_size;
  uint8_t *glyph_data;
  byte local_185;
  int local_184;
  undefined1 local_180 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  uint local_c0;
  undefined1 local_b8 [24];
  vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
  local_a0;
  uint8_t *local_88;
  uint local_80;
  bool local_7c;
  mapped_type *local_78;
  mapped_type *local_70;
  ulong local_68;
  Font *local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  size_t local_40;
  uint8_t *local_38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  pTVar11 = Font::FindTable(font,0x676c7966);
  this = Font::FindTable(font,0x6c6f6361);
  bVar8 = true;
  if (pTVar11 != (Table *)0x0 || this != (Table *)0x0) {
    if ((this == (Table *)0x0) == (pTVar11 == (Table *)0x0)) {
      bVar8 = Font::Table::IsReused(this);
      bVar9 = Font::Table::IsReused(pTVar11);
      if (bVar8 == bVar9) {
        bVar8 = Font::Table::IsReused(this);
        if (bVar8) {
          return true;
        }
        local_180._0_4_ = 0xe7ecf9e6;
        local_70 = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[](&font->tables,(key_type *)local_180);
        local_180._0_4_ = 0xecefe3e1;
        local_78 = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[](&font->tables,(key_type *)local_180);
        uVar10 = NumGlyphs(font);
        memset(local_180,0,0xc0);
        local_c0 = uVar10;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_120,(long)(int)((int)(uVar10 + 0x1f) >> 3 & 0xfffffffc));
        if (0 < (int)uVar10) {
          iVar18 = 0;
          local_68 = (ulong)uVar10;
          local_60 = font;
          do {
            local_b8._8_2_ = 0;
            local_a0.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_a0.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_a0.
            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_80 = 0;
            local_184 = iVar18;
            bVar8 = GetGlyphData(local_60,iVar18,&local_38,&local_40);
            if ((!bVar8) ||
               ((local_40 != 0 && (bVar8 = ReadGlyph(local_38,local_40,(Glyph *)local_b8), !bVar8)))
               ) {
              std::
              vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ::~vector(&local_a0);
              goto LAB_00109d1f;
            }
            if (local_80 == 0) {
              if ((long)local_a0.
                        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_a0.
                        super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start == 0) {
                anon_unknown_2::WriteUShort
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,0);
              }
              else {
                uVar10 = (int)((long)local_a0.
                                     super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a0.
                                     super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
                anon_unknown_2::WriteUShort
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,uVar10
                          );
                if ((local_a0.
                     super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start ==
                     local_a0.
                     super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) ||
                   (pPVar15 = ((local_a0.
                                super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                              )._M_impl.super__Vector_impl_data._M_start,
                   pPVar15 ==
                   ((local_a0.
                     super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>).
                   _M_impl.super__Vector_impl_data._M_finish)) {
                  if (local_b8._0_8_ != 0) goto LAB_00109559;
                }
                else {
                  uVar1 = pPVar15->x;
                  uVar2 = pPVar15->y;
                  auVar23._4_4_ = uVar2;
                  auVar23._0_4_ = uVar1;
                  auVar23._8_8_ = 0;
                  auVar23 = pshuflw(auVar23,auVar23,0xa0);
                  pvVar12 = local_a0.
                            super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    pPVar15 = (pvVar12->
                              super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    while( true ) {
                      if (pPVar15 ==
                          (pvVar12->
                          super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                          )._M_impl.super__Vector_impl_data._M_finish) break;
                      auVar24._0_12_ = in_XMM1._0_12_;
                      auVar24._12_2_ = in_XMM1._6_2_;
                      auVar24._14_2_ = auVar23._6_2_;
                      auVar32._12_4_ = auVar24._12_4_;
                      auVar32._0_10_ = in_XMM1._0_10_;
                      auVar32._10_2_ = auVar23._4_2_;
                      auVar30._10_6_ = auVar32._10_6_;
                      auVar30._0_8_ = in_XMM1._0_8_;
                      auVar30._8_2_ = in_XMM1._4_2_;
                      auVar5._4_8_ = auVar30._8_8_;
                      auVar5._2_2_ = auVar23._2_2_;
                      auVar5._0_2_ = in_XMM1._2_2_;
                      iVar18 = auVar30._8_4_ >> 0x10;
                      uVar21._0_4_ = pPVar15->x;
                      uVar21._4_4_ = pPVar15->y;
                      auVar29._8_8_ = 0;
                      auVar29._0_8_ = uVar21;
                      auVar30 = pshuflw(auVar29,auVar29,0xa0);
                      iVar38 = -(uint)((int)uVar21._4_4_ < iVar18);
                      iVar37 = -(uint)(auVar32._12_4_ >> 0x10 < (int)uVar21._4_4_);
                      auVar25._4_4_ = -(uint)(auVar5._0_4_ >> 0x10 < (int)(undefined4)uVar21);
                      auVar25._0_4_ = iVar37;
                      auVar25._8_4_ = -(uint)(iVar18 < (int)uVar21._4_4_);
                      auVar25._12_4_ = iVar37;
                      in_XMM1 = pshuflw(auVar25,auVar25,0xe2);
                      auVar31._4_4_ = iVar38;
                      auVar31._0_4_ = -(uint)((int)(undefined4)uVar21 < (int)auVar23._0_2_);
                      auVar31._8_4_ = iVar38;
                      auVar31._12_4_ = -(uint)((int)uVar21._4_4_ < auVar32._12_4_ >> 0x10);
                      auVar32 = pshuflw(auVar31,auVar31,0xe8);
                      auVar36._0_12_ = auVar32._0_12_;
                      auVar36._12_2_ = auVar32._6_2_;
                      auVar36._14_2_ = in_XMM1._6_2_;
                      auVar35._12_4_ = auVar36._12_4_;
                      auVar35._0_10_ = auVar32._0_10_;
                      auVar35._10_2_ = in_XMM1._4_2_;
                      auVar34._10_6_ = auVar35._10_6_;
                      auVar34._0_8_ = auVar32._0_8_;
                      auVar34._8_2_ = auVar32._4_2_;
                      auVar33._8_8_ = auVar34._8_8_;
                      auVar33._6_2_ = in_XMM1._2_2_;
                      auVar33._4_2_ = auVar32._2_2_;
                      auVar33._0_2_ = auVar32._0_2_;
                      auVar33._2_2_ = in_XMM1._0_2_;
                      auVar23 = ~auVar33 & auVar23 | auVar30 & auVar33;
                      pPVar15 = pPVar15 + 1;
                    }
                    pvVar12 = pvVar12 + 1;
                  } while (pvVar12 !=
                           local_a0.
                           super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                  in_XMM1._0_2_ = -(ushort)((short)local_b8._0_8_ == auVar23._0_2_);
                  sVar26 = -(ushort)(SUB82(local_b8._0_8_,2) == auVar23._2_2_);
                  sVar27 = -(ushort)(SUB82(local_b8._0_8_,4) == auVar23._4_2_);
                  sVar28 = -(ushort)(SUB82(local_b8._0_8_,6) == auVar23._6_2_);
                  in_XMM1._8_8_ =
                       (undefined8)
                       (CONCAT64(CONCAT42(CONCAT22(sVar28,sVar28),sVar27),CONCAT22(sVar27,sVar28))
                       >> 0x10);
                  in_XMM1._6_2_ = sVar26;
                  in_XMM1._4_2_ = sVar26;
                  in_XMM1._2_2_ = in_XMM1._0_2_;
                  iVar18 = movmskps((int)pvVar12,in_XMM1);
                  if (iVar18 != 0xf) {
LAB_00109559:
                    anon_unknown_2::GlyfEncoder::WriteBbox
                              ((GlyfEncoder *)local_180,local_184,(Glyph *)local_b8);
                  }
                }
                if (0 < (int)uVar10) {
                  lVar20 = 8;
                  uVar21 = (ulong)(uVar10 & 0x7fffffff);
                  do {
                    woff2::Write255UShort
                              ((vector *)&local_168,
                               (int)((ulong)(*(long *)((long)&((local_a0.
                                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  lVar20) -
                                            *(long *)((long)local_a0.
                                                  super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar20 + -8)) >> 2) * -0x55555555);
                    in_XMM1._8_8_ = extraout_XMM1_Qb;
                    in_XMM1._0_8_ = extraout_XMM1_Qa;
                    lVar20 = lVar20 + 0x18;
                    uVar21 = uVar21 - 1;
                  } while (uVar21 != 0);
                  uVar21 = 0;
                  iVar18 = 0;
                  iVar37 = 0;
                  local_58 = (ulong)(uVar10 & 0x7fffffff);
                  do {
                    local_48 = uVar21 * 3;
                    uVar10 = (int)((long)local_a0.
                                         super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_a0.
                                         super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar21].
                                         super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                             -0x55555555;
                    local_50 = uVar21;
                    if (0 < (int)uVar10) {
                      uVar21 = (ulong)(uVar10 & 0x7fffffff);
                      lVar20 = 8;
                      iVar38 = iVar37;
                      iVar19 = iVar18;
                      do {
                        pPVar15 = (&((local_a0.
                                      super__Vector_base<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>
                                    )._M_impl.super__Vector_impl_data._M_start)[local_48];
                        iVar18 = *(int *)((long)pPVar15 + lVar20 + -8);
                        iVar37 = *(int *)((long)pPVar15 + lVar20 + -4);
                        uVar13 = iVar37 - iVar38;
                        uVar14 = iVar18 - iVar19;
                        uVar10 = -uVar14;
                        if (0 < (int)uVar14) {
                          uVar10 = uVar14;
                        }
                        uVar17 = -uVar13;
                        if (0 < (int)uVar13) {
                          uVar17 = uVar13;
                        }
                        local_185 = (*(byte *)((long)&pPVar15->x + lVar20) ^ 1) * -0x80;
                        bVar4 = ~(byte)(uVar13 >> 0x18);
                        bVar16 = (byte)uVar17;
                        if ((iVar18 == iVar19) && (uVar17 < 0x500)) {
                          local_185 = (byte)(uVar17 >> 7) & 0xe | bVar4 >> 7 | local_185;
                          if (local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish ==
                              local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                            _M_realloc_insert<unsigned_char>
                                      (&local_150,
                                       (iterator)
                                       local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                          }
                          else {
                            *local_150.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish = local_185;
                            local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish =
                                 local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + 1;
                          }
                          local_185 = bVar16;
                          if (local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish !=
                              local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010974f;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                          _M_realloc_insert<unsigned_char>
                                    (&local_f0,
                                     (iterator)
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                        }
                        else {
                          bVar6 = ~(byte)(uVar14 >> 0x18);
                          bVar22 = (byte)uVar10;
                          if ((iVar37 == iVar38) && (uVar10 < 0x500)) {
                            local_185 = ((byte)(uVar10 >> 7) & 0xe | bVar6 >> 7) + local_185 + 10;
                            if (local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_150,
                                         (iterator)
                                         local_150.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              *local_150.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish = local_185;
                              local_150.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            if (local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish ==
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage) {
                              local_185 = bVar22;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_f0,
                                         (iterator)
                                         local_f0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              *local_f0.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish = bVar22;
                              local_185 = bVar22;
LAB_001097f1:
                              local_f0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish =
                                   local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                          }
                          else {
                            bVar4 = ((char)bVar4 >> 7) * -2 - ((char)bVar6 >> 7);
                            if ((uVar10 < 0x41) && (uVar17 < 0x41)) {
                              local_185 = ((byte)(uVar17 - 1 >> 2) & 0xc) +
                                          local_185 + bVar4 + ((byte)(uVar10 - 1) & 0x30) + 0x14;
                              if (local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_150,
                                           (iterator)
                                           local_150.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              uVar17 = uVar17 - 1 & 0xf | (uVar10 - 1) * 0x10;
                              local_185 = (byte)uVar17;
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              goto LAB_0010974f;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_f0,
                                         (iterator)
                                         local_f0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else if ((uVar10 < 0x301) && (uVar17 < 0x301)) {
                              uVar17 = uVar17 - 1;
                              local_185 = (local_185 | bVar4) + ((byte)(uVar10 - 1 >> 8) & 3) * '\f'
                                          + ((byte)(uVar17 >> 6) & 0xc) + 0x54;
                              if (local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_150,
                                           (iterator)
                                           local_150.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_150.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_150.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = (byte)(uVar10 - 1);
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish ==
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                *local_f0.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish = local_185;
                                local_f0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish =
                                     local_f0.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish + 1;
                              }
                              local_185 = (byte)uVar17;
                              if (local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish !=
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)
                              goto LAB_0010974f;
                              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                              _M_realloc_insert<unsigned_char>
                                        (&local_f0,
                                         (iterator)
                                         local_f0.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                            }
                            else {
                              bVar6 = (byte)(uVar17 >> 8);
                              if ((uVar10 < 0x1000) && (uVar17 < 0x1000)) {
                                local_185 = bVar4 | local_185 | 0x78;
                                if (local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_150,
                                             (iterator)
                                             local_150.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = local_185;
                                  local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                local_185 = (byte)(uVar10 >> 4);
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_f0,
                                             (iterator)
                                             local_f0.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = local_185;
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                local_185 = bVar6 | (byte)(uVar10 << 4);
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_f0,
                                             (iterator)
                                             local_f0.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = local_185;
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                local_185 = bVar16;
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish !=
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0010974f:
                                  *local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = (uchar)uVar17;
                                  goto LAB_001097f1;
                                }
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                              else {
                                local_185 = bVar4 | local_185 | 0x7c;
                                if (local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_150.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_150,
                                             (iterator)
                                             local_150.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_150.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = local_185;
                                  local_150.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_150.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                local_185 = (byte)(uVar10 >> 8);
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_f0,
                                             (iterator)
                                             local_f0.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = local_185;
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  local_185 = bVar22;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_f0,
                                             (iterator)
                                             local_f0.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = bVar22;
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish ==
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                  local_185 = bVar6;
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                  _M_realloc_insert<unsigned_char>
                                            (&local_f0,
                                             (iterator)
                                             local_f0.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                                }
                                else {
                                  *local_f0.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish = bVar6;
                                  local_f0.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish =
                                       local_f0.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                                }
                                local_185 = bVar16;
                                if (local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish !=
                                    local_f0.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)
                                goto LAB_0010974f;
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                _M_realloc_insert<unsigned_char>
                                          (&local_f0,
                                           (iterator)
                                           local_f0.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish,&local_185);
                              }
                            }
                          }
                        }
                        lVar20 = lVar20 + 0xc;
                        uVar21 = uVar21 - 1;
                        iVar38 = iVar37;
                        iVar19 = iVar18;
                      } while (uVar21 != 0);
                    }
                    uVar21 = local_50 + 1;
                  } while (uVar21 != local_58);
                  goto LAB_00109b39;
                }
              }
            }
            else {
              anon_unknown_2::WriteUShort
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,-1);
              anon_unknown_2::GlyfEncoder::WriteBbox
                        ((GlyfEncoder *)local_180,local_184,(Glyph *)local_b8);
              __src = local_88;
              uVar21 = (ulong)local_80;
              if (uVar21 != 0) {
                lVar20 = CONCAT44(local_138.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (int)local_138.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish) -
                         CONCAT44(local_138.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (int)local_138.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_138,uVar21 + lVar20);
                memcpy((void *)(lVar20 + CONCAT44(local_138.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)local_138.
                                                                                                              
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)),__src,
                       uVar21);
              }
              if (local_7c != false) {
LAB_00109b39:
                anon_unknown_2::GlyfEncoder::WriteInstructions
                          ((GlyfEncoder *)local_180,(Glyph *)local_b8);
              }
            }
            std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::~vector(&local_a0);
            iVar18 = local_184 + 1;
            font = local_60;
          } while (iVar18 != (int)local_68);
        }
        pmVar7 = local_70;
        out = &local_70->buffer;
        anon_unknown_2::WriteLong(out,0);
        anon_unknown_2::WriteUShort(out,local_c0);
        anon_unknown_2::WriteUShort(out,0);
        anon_unknown_2::WriteLong(out,local_180._8_4_ - local_180._0_4_);
        anon_unknown_2::WriteLong
                  (out,(int)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,(int)local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_150.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,(int)local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_f0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,(int)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteLong
                  (out,((int)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish +
                       (int)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish) -
                       ((int)local_120.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                       (int)local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
        anon_unknown_2::WriteLong
                  (out,(int)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_d8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        anon_unknown_2::WriteBytes
                  (out,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
        anon_unknown_2::WriteBytes(out,&local_168);
        anon_unknown_2::WriteBytes(out,&local_150);
        anon_unknown_2::WriteBytes(out,&local_f0);
        anon_unknown_2::WriteBytes(out,&local_138);
        anon_unknown_2::WriteBytes(out,&local_120);
        anon_unknown_2::WriteBytes(out,&local_108);
        anon_unknown_2::WriteBytes(out,&local_d8);
        pTVar11 = Font::FindTable(font,0x68656164);
        if ((pTVar11 == (Table *)0x0) || (pTVar11->length < 0x34)) {
LAB_00109d1f:
          bVar8 = false;
        }
        else {
          (pmVar7->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start[7] = pTVar11->data[0x33];
          pmVar7->tag = 0xe7ecf9e6;
          puVar3 = (pmVar7->buffer).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pmVar7->length =
               *(int *)&(pmVar7->buffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar3;
          pmVar7->data = puVar3;
          local_78->tag = 0xecefe3e1;
          local_78->length = 0;
          local_78->data = (uint8_t *)0x0;
          bVar8 = true;
        }
        anon_unknown_2::GlyfEncoder::~GlyfEncoder((GlyfEncoder *)local_180);
        return bVar8;
      }
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool TransformGlyfAndLocaTables(Font* font) {
  // no transform for CFF
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* loca_table = font->FindTable(kLocaTableTag);

  // If you don't have glyf/loca this transform isn't very interesting
  if (loca_table == NULL && glyf_table == NULL) {
    return true;
  }
  // It would be best if you didn't have just one of glyf/loca
  if ((glyf_table == NULL) != (loca_table == NULL)) {
    return FONT_COMPRESSION_FAILURE();
  }
  // Must share neither or both loca & glyf
  if (loca_table->IsReused() != glyf_table->IsReused()) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (loca_table->IsReused()) {
    return true;
  }

  Font::Table* transformed_glyf = &font->tables[kGlyfTableTag ^ 0x80808080];
  Font::Table* transformed_loca = &font->tables[kLocaTableTag ^ 0x80808080];

  int num_glyphs = NumGlyphs(*font);
  GlyfEncoder encoder(num_glyphs);
  for (int i = 0; i < num_glyphs; ++i) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    encoder.Encode(i, glyph);
  }
  encoder.GetTransformedGlyfBytes(&transformed_glyf->buffer);

  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL || head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }
  transformed_glyf->buffer[7] = head_table->data[51];  // index_format

  transformed_glyf->tag = kGlyfTableTag ^ 0x80808080;
  transformed_glyf->length = transformed_glyf->buffer.size();
  transformed_glyf->data = transformed_glyf->buffer.data();

  transformed_loca->tag = kLocaTableTag ^ 0x80808080;
  transformed_loca->length = 0;
  transformed_loca->data = NULL;

  return true;
}